

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

int ps_lattice_write(ps_lattice_t *dag,char *filename)

{
  ps_latnode_t *ppVar1;
  ps_latnode_t *ppVar2;
  ps_latnode_t *ppVar3;
  latlink_list_t *plVar4;
  int iVar5;
  FILE *__s;
  ps_latnode_t **pppVar6;
  char *pcVar7;
  uint uVar8;
  ps_latnode_t **pppVar9;
  latlink_list_t **pplVar10;
  
  ppVar1 = dag->start;
  ppVar2 = dag->end;
  uVar8 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0xd9,"Writing lattice file: %s\n",filename);
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0xdb,"Failed to open lattice file \'%s\' for writing",filename);
    iVar5 = -1;
  }
  else {
    fwrite("# getcwd: /this/is/bogus\n",0x19,1,__s);
    logmath_get_base(dag->lmath);
    fprintf(__s,"# -logbase %e\n");
    fwrite("#\n",2,1,__s);
    fprintf(__s,"Frames %d\n",(ulong)(uint)dag->n_frames);
    fwrite("#\n",2,1,__s);
    pppVar9 = &dag->nodes;
    for (pppVar6 = pppVar9; *pppVar6 != (ps_latnode_t *)0x0; pppVar6 = &(*pppVar6)->next) {
      uVar8 = uVar8 + 1;
    }
    fprintf(__s,"Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",(ulong)uVar8);
    uVar8 = 0;
    pppVar6 = pppVar9;
    while (ppVar3 = *pppVar6, ppVar3 != (ps_latnode_t *)0x0) {
      if ((long)ppVar3->wid < 0) {
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = dag->dict->word[ppVar3->wid].word;
      }
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "(null)";
      }
      ppVar3->id = uVar8;
      fprintf(__s,"%d %s %d %d %d ; %d\n",(ulong)uVar8,pcVar7,(ulong)(uint)ppVar3->sf,
              (ulong)(uint)ppVar3->fef,(ulong)(uint)ppVar3->lef,(ulong)(uint)ppVar3->node_id);
      uVar8 = uVar8 + 1;
      pppVar6 = &ppVar3->next;
    }
    fwrite("#\n",2,1,__s);
    fprintf(__s,"Initial %d\nFinal %d\n",(ulong)(uint)ppVar1->id,(ulong)(uint)ppVar2->id);
    fwrite("#\n",2,1,__s);
    fprintf(__s,"BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",0);
    fwrite("#\n",2,1,__s);
    fwrite("Edges (FROM-NODEID TO-NODEID ASCORE)\n",0x25,1,__s);
    while (ppVar1 = *pppVar9, ppVar1 != (ps_latnode_t *)0x0) {
      pplVar10 = &ppVar1->exits;
      while (plVar4 = *pplVar10, plVar4 != (latlink_list_t *)0x0) {
        iVar5 = plVar4->link->ascr;
        if (0xdffffffe < iVar5 - 1U) {
          fprintf(__s,"%d %d %d\n",(ulong)(uint)ppVar1->id,(ulong)(uint)plVar4->link->to->id,
                  (ulong)(uint)(iVar5 << 10));
        }
        pplVar10 = &plVar4->next;
      }
      pppVar9 = &ppVar1->next;
    }
    fwrite("End\n",4,1,__s);
    fclose(__s);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int32
ps_lattice_write(ps_lattice_t *dag, char const *filename)
{
    FILE *fp;
    int32 i;
    ps_latnode_t *d, *initial, *final;

    initial = dag->start;
    final = dag->end;

    E_INFO("Writing lattice file: %s\n", filename);
    if ((fp = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open lattice file '%s' for writing", filename);
        return -1;
    }

    /* Stupid Sphinx-III lattice code expects 'getcwd:' here */
    fprintf(fp, "# getcwd: /this/is/bogus\n");
    fprintf(fp, "# -logbase %e\n", logmath_get_base(dag->lmath));
    fprintf(fp, "#\n");

    fprintf(fp, "Frames %d\n", dag->n_frames);
    fprintf(fp, "#\n");

    for (i = 0, d = dag->nodes; d; d = d->next, i++);
    fprintf(fp,
            "Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",
            i);
    for (i = 0, d = dag->nodes; d; d = d->next, i++) {
        const char *word = dict_wordstr(dag->dict, d->wid);
        if (word == NULL)
            word = "(null)";
        d->id = i;
        fprintf(fp, "%d %s %d %d %d ; %d\n",
                i, word,
                d->sf, d->fef, d->lef, d->node_id);
    }
    fprintf(fp, "#\n");

    fprintf(fp, "Initial %d\nFinal %d\n", initial->id, final->id);
    fprintf(fp, "#\n");

    /* Don't bother with this, it's not used by anything. */
    fprintf(fp, "BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",
            0 /* #BPTable entries */ );
    fprintf(fp, "#\n");

    fprintf(fp, "Edges (FROM-NODEID TO-NODEID ASCORE)\n");
    for (d = dag->nodes; d; d = d->next) {
        latlink_list_t *l;
        for (l = d->exits; l; l = l->next) {
            if (l->link->ascr WORSE_THAN WORST_SCORE || l->link->ascr BETTER_THAN 0)
                continue;
            fprintf(fp, "%d %d %d\n",
                    d->id, l->link->to->id, l->link->ascr << SENSCR_SHIFT);
        }
    }
    fprintf(fp, "End\n");
    fclose(fp);

    return 0;
}